

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_mffscrn(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 dst;
  TCGv_i64 t1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
      dst = tcg_temp_new_i64(tcg_ctx_00);
      regno = rB(ctx->opcode);
      get_fpr(tcg_ctx_00,dst,regno);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,dst,dst,3);
      gen_helper_mffscrn(ctx,dst);
      tcg_temp_free_i64(tcg_ctx_00,dst);
    }
    else {
      gen_exception(ctx,7);
    }
  }
  return;
}

Assistant:

static void gen_mffscrn(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t1 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    /* Mask FRB to get just RN.  */
    tcg_gen_andi_i64(tcg_ctx, t1, t1, FP_RN);

    gen_helper_mffscrn(ctx, t1);

    tcg_temp_free_i64(tcg_ctx, t1);
}